

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

ostream * cppnet::operator<<(ostream *out,Address *addr)

{
  string str;
  string local_30;
  
  Address::AsString_abi_cxx11_(&local_30,addr);
  std::ostream::write((char *)out,(long)local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<< (std::ostream &out, Address &addr) {
    const std::string str = addr.AsString();
    out.write(str.c_str(), str.length());
    return out;
}